

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O0

bool TestConstExpr::NotEqualTest<unsigned_long_long,int>(void)

{
  bool bVar1;
  uint in_stack_ffffffffffffffa8;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> in_stack_ffffffffffffffac;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>
  in_stack_ffffffffffffffb0;
  int local_34;
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> local_30;
  undefined4 local_2c;
  undefined4 local_1c;
  undefined4 local_c;
  
  local_c = 3;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
            ((SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_ffffffffffffffb0.m_int,
             (int *)CONCAT44(in_stack_ffffffffffffffac.m_int,in_stack_ffffffffffffffa8));
  bVar1 = ::operator!=(in_stack_ffffffffffffffac.m_int,in_stack_ffffffffffffffb0);
  uVar2 = in_stack_ffffffffffffffa8 & 0xffffff;
  uVar4 = uVar2;
  if (bVar1) {
    local_1c = 4;
    SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
              ((SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
               in_stack_ffffffffffffffb0.m_int,
               (int *)(CONCAT44(in_stack_ffffffffffffffac.m_int,in_stack_ffffffffffffffa8) &
                      0xffffffff00ffffff));
    bVar1 = ::operator!=(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac.m_int);
    uVar3 = uVar2 & 0xffffff;
    uVar4 = uVar3;
    if (bVar1) {
      local_2c = 6;
      SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::
      SafeInt<int>((SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>
                    *)in_stack_ffffffffffffffb0.m_int,
                   (int *)(CONCAT44(in_stack_ffffffffffffffac.m_int,uVar2) & 0xffffffff00ffffff));
      local_34 = 7;
      SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt
                (&local_30,&local_34);
      bVar1 = ::operator!=(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
      uVar2 = uVar3 & 0xffffff;
      uVar4 = uVar2;
      if (bVar1) {
        SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::
        SafeInt<int>((SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>
                      *)in_stack_ffffffffffffffb0.m_int,
                     (int *)(CONCAT44(in_stack_ffffffffffffffac.m_int,uVar3) & 0xffffffff00ffffff));
        bVar1 = ::operator!=(SUB41((uint)in_stack_ffffffffffffffac.m_int >> 0x18,0),
                             in_stack_ffffffffffffffb0);
        uVar4 = uVar2 & 0xffffff;
        if (bVar1) {
          bVar1 = false;
          SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::
          SafeInt<int>((SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)in_stack_ffffffffffffffb0.m_int,(int *)(ulong)(uVar2 & 0xffffff));
          bVar1 = ::operator!=(bVar1,in_stack_ffffffffffffffb0);
          uVar4 = (uint)bVar1 << 0x18;
        }
      }
    }
  }
  return SUB41(uVar4 >> 0x18,0);
}

Assistant:

SAFEINT_CONSTEXPR11 bool NotEqualTest()
	{
		return
			(U)2 != SafeInt<T>(3) &&
			SafeInt<T>(4) != (U)5 &&
			SafeInt<T>(6) != SafeInt<U>(7) &&
			true != SafeInt<T>(1) &&
			false != SafeInt<T>(0);
	}